

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int string_buffer_init2(JSContext *ctx,StringBuffer *s,int size,int is_wide)

{
  int iVar1;
  JSString *pJVar2;
  
  s->ctx = ctx;
  s->size = size;
  s->len = 0;
  s->is_wide_char = is_wide;
  s->error_status = 0;
  pJVar2 = js_alloc_string(ctx,size,is_wide);
  s->str = pJVar2;
  iVar1 = 0;
  if (pJVar2 == (JSString *)0x0) {
    s->size = 0;
    s->error_status = -1;
    iVar1 = -1;
  }
  return iVar1;
}

Assistant:

static int string_buffer_init2(JSContext *ctx, StringBuffer *s, int size,
                               int is_wide)
{
    s->ctx = ctx;
    s->size = size;
    s->len = 0;
    s->is_wide_char = is_wide;
    s->error_status = 0;
    s->str = js_alloc_string(ctx, size, is_wide);
    if (unlikely(!s->str)) {
        s->size = 0;
        return s->error_status = -1;
    }
#ifdef DUMP_LEAKS
    /* the StringBuffer may reallocate the JSString, only link it at the end */
    list_del(&s->str->link);
#endif
    return 0;
}